

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::ColorTooltip(char *text,float *col,ImGuiColorEditFlags flags)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ImGuiContext *pIVar6;
  char *text_end;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ImVec2 size;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  ImVec4 local_48;
  undefined1 local_38 [16];
  
  pIVar6 = GImGui;
  BeginTooltipEx(0,1);
  if (text != (char *)0x0) {
    text_end = FindRenderedTextEnd(text,(char *)0x0);
    if (text < text_end) {
      TextEx(text,text_end,0);
      Separator();
    }
  }
  fVar1 = (pIVar6->Style).FramePadding.y;
  local_38._8_8_ = 0;
  local_38._0_8_ = *(ulong *)col;
  fVar2 = col[2];
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 + fVar1)),ZEXT416((uint)pIVar6->FontSize),
                           ZEXT416(0x40400000));
  local_48.w = 1.0;
  if ((flags & 2U) == 0) {
    local_48.w = col[3];
  }
  local_48._0_8_ = vmovlps_avx(local_38);
  size.x = auVar7._0_4_;
  size.y = size.x;
  if ((flags & 2U) == 0) {
    auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)col[3]));
    uVar3 = vcmpss_avx512f(ZEXT416((uint)col[3]),ZEXT816(0) << 0x40,1);
    auVar7._0_4_ = (uint)!(bool)((byte)uVar3 & 1) * auVar7._0_4_;
    vfmadd213ss_fma(auVar7,SUB6416(ZEXT464(0x437f0000),0),ZEXT416(0x3f000000));
  }
  local_48.z = fVar2;
  ColorButton("##preview",&local_48,flags & 0x18060002U | 0x40,size);
  SameLine(0.0,-1.0);
  dVar11 = (double)*col;
  dVar12 = (double)col[1];
  dVar13 = (double)col[2];
  if ((flags & 0x18000000U) == 0x10000000) {
    if ((flags & 2U) == 0) {
      Text("H: %.3f, S: %.3f, V: %.3f, A: %.3f",dVar11,dVar12,dVar13,(double)col[3]);
    }
    else {
      Text("H: %.3f, S: %.3f, V: %.3f",dVar11,dVar12,dVar13);
    }
  }
  else {
    auVar14 = ZEXT816(0) << 0x40;
    auVar10 = vmovshdup_avx(local_38);
    auVar8 = SUB6416(ZEXT464(0x3f800000),0);
    auVar7 = vminss_avx(auVar8,local_38);
    uVar3 = vcmpss_avx512f(local_38,auVar14,1);
    uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar2),auVar14,1);
    auVar9 = vminss_avx(auVar8,auVar10);
    uVar5 = vcmpss_avx512f(auVar10,auVar14,1);
    auVar10 = vminss_avx(auVar8,ZEXT416((uint)fVar2));
    auVar8._4_12_ = auVar7._4_12_;
    auVar8._0_4_ = (uint)!(bool)((byte)uVar3 & 1) * auVar7._0_4_;
    auVar9._0_4_ = (uint)!(bool)((byte)uVar5 & 1) * auVar9._0_4_;
    auVar10._0_4_ = (uint)!(bool)((byte)uVar4 & 1) * auVar10._0_4_;
    auVar7 = SUB6416(ZEXT464(0x3f000000),0);
    auVar14 = SUB6416(ZEXT464(0x437f0000),0);
    vfmadd213ss_fma(auVar8,auVar14,auVar7);
    vfmadd213ss_fma(auVar9,auVar14,auVar7);
    vfmadd213ss_fma(auVar10,auVar14,auVar7);
    if ((flags & 2U) == 0) {
      Text("#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)",dVar11,dVar12,
           dVar13,(double)col[3]);
    }
    else {
      Text("#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)",dVar11,dVar12,dVar13);
    }
  }
  EndTooltip();
  return;
}

Assistant:

void ImGui::ColorTooltip(const char* text, const float* col, ImGuiColorEditFlags flags)
{
    ImGuiContext& g = *GImGui;

    BeginTooltipEx(0, ImGuiTooltipFlags_OverridePreviousTooltip);
    const char* text_end = text ? FindRenderedTextEnd(text, NULL) : text;
    if (text_end > text)
    {
        TextEx(text, text_end);
        Separator();
    }

    ImVec2 sz(g.FontSize * 3 + g.Style.FramePadding.y * 2, g.FontSize * 3 + g.Style.FramePadding.y * 2);
    ImVec4 cf(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
    int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
    ColorButton("##preview", cf, (flags & (ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf)) | ImGuiColorEditFlags_NoTooltip, sz);
    SameLine();
    if ((flags & ImGuiColorEditFlags_InputRGB) || !(flags & ImGuiColorEditFlags__InputMask))
    {
        if (flags & ImGuiColorEditFlags_NoAlpha)
            Text("#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)", cr, cg, cb, cr, cg, cb, col[0], col[1], col[2]);
        else
            Text("#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)", cr, cg, cb, ca, cr, cg, cb, ca, col[0], col[1], col[2], col[3]);
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        if (flags & ImGuiColorEditFlags_NoAlpha)
            Text("H: %.3f, S: %.3f, V: %.3f", col[0], col[1], col[2]);
        else
            Text("H: %.3f, S: %.3f, V: %.3f, A: %.3f", col[0], col[1], col[2], col[3]);
    }
    EndTooltip();
}